

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<bool>::PromiseResolver
          (PromiseResolver<bool> *this,QPromise<bool> *promise)

{
  Data *pDVar1;
  QPromise<bool> *this_00;
  QPromise<bool> *promise_local;
  PromiseResolver<bool> *this_local;
  
  pDVar1 = (Data *)operator_new(0x10);
  QSharedData::QSharedData((QSharedData *)pDVar1);
  pDVar1->promise = (QPromise<bool> *)0x0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>::
  QExplicitlySharedDataPointer(&this->m_d,pDVar1);
  this_00 = (QPromise<bool> *)operator_new(0x10);
  QtPromise::QPromise<bool>::QPromise(this_00,promise);
  pDVar1 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<bool>::Data>::operator->
                     (&this->m_d);
  pDVar1->promise = this_00;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }